

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O2

walk_result __thiscall
jsoncons::jsonschema::
min_items_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::do_validate(min_items_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              *this,eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    *context,
             basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *instance,
             json_pointer *instance_location,evaluation_results *param_4,error_reporter *reporter,
             basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *param_6)

{
  ulong __val;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  walk_result wVar4;
  string message;
  string local_1a0;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  this_context;
  validation_message local_148;
  
  bVar1 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_array
                    (instance);
  if (!bVar1) {
    return advance;
  }
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::eval_context(&this_context,context,
                 &(this->
                  super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  ).
                  super_keyword_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  .keyword_name_);
  sVar3 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size(instance)
  ;
  __val = *(ulong *)&(this->
                     super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                     ).field_0xe0;
  if (sVar3 < __val) {
    std::__cxx11::to_string(&local_148.keyword_,__val);
    std::operator+(&message,"Minimum number of items is ",&local_148.keyword_);
    std::__cxx11::string::~string((string *)&local_148);
    sVar3 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                      (instance);
    std::__cxx11::to_string(&local_1a0,sVar3);
    std::operator+(&local_148.keyword_," but found ",&local_1a0);
    std::__cxx11::string::append((string *)&message);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_1a0);
    (*(this->
      super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      ).
      super_keyword_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      .super_validation_message_factory._vptr_validation_message_factory[2])
              (&local_148,this,&this_context.eval_path_,instance_location,&message);
    reporter->error_count_ = reporter->error_count_ + 1;
    iVar2 = (*reporter->_vptr_error_reporter[2])(reporter,&local_148);
    validation_message::~validation_message(&local_148);
    std::__cxx11::string::~string((string *)&message);
    if (iVar2 == 1) {
      wVar4 = abort;
      goto LAB_00391dbd;
    }
  }
  wVar4 = advance;
LAB_00391dbd:
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::~eval_context(&this_context);
  return wVar4;
}

Assistant:

walk_result do_validate(const eval_context<Json>& context, const Json& instance, 
            const jsonpointer::json_pointer& instance_location,
            evaluation_results& /*results*/, 
            error_reporter& reporter,
            Json& /*patch*/) const final
        {
            if (!instance.is_array())
            {
                return walk_result::advance;
            }

            eval_context<Json> this_context(context, this->keyword_name());

            if (instance.size() < min_items_)
            {
                std::string message("Minimum number of items is " + std::to_string(min_items_));
                message.append(" but found " + std::to_string(instance.size()));
                walk_result result = reporter.error(this->make_validation_message(
                    this_context.eval_path(),
                    instance_location, 
                    std::move(message)));
                if (result == walk_result::abort)
                {
                    return result;
                }
            }          
            return walk_result::advance;
        }